

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall
Printer_printModelImportingModelParentComponent_Test::
Printer_printModelImportingModelParentComponent_Test
          (Printer_printModelImportingModelParentComponent_Test *this)

{
  Printer_printModelImportingModelParentComponent_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Printer_printModelImportingModelParentComponent_Test_00123090;
  return;
}

Assistant:

TEST(Printer, printModelImportingModelParentComponent)
{
    auto parser = libcellml::Parser::create();
    auto modelContents = fileContents("importingModelParentComponent.cellml");
    auto model = parser->parseModel(modelContents);
    EXPECT_EQ(size_t(0), parser->errorCount());

    auto validator = libcellml::Validator::create();
    validator->validateModel(model);
    EXPECT_EQ(size_t(0), validator->issueCount());

    auto printer = libcellml::Printer::create();
    auto serialisedModel = printer->printModel(model);

    EXPECT_EQ(modelContents, serialisedModel);
}